

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int ossl_new_session_cb(SSL *ssl,SSL_SESSION *ssl_sessionid)

{
  byte bVar1;
  Curl_easy *data;
  _Bool _Var2;
  uint idx;
  uint idx_00;
  CURLcode CVar3;
  connectdata *conn;
  void *pvVar4;
  int sockindex;
  int iVar5;
  void *old_ssl_sessionid;
  SSL_SESSION *local_38;
  
  idx = ossl_get_ssl_conn_index();
  idx_00 = ossl_get_ssl_sockindex_index();
  if ((int)(idx | idx_00) < 0) {
    return 0;
  }
  conn = (connectdata *)SSL_get_ex_data((SSL *)ssl,idx);
  if (conn == (connectdata *)0x0) {
    return 0;
  }
  data = conn->data;
  pvVar4 = SSL_get_ex_data((SSL *)ssl,idx_00);
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
    bVar1 = (data->set).proxy_ssl.primary.field_0x48;
  }
  else {
    bVar1 = (data->set).ssl.primary.field_0x48;
  }
  if ((bVar1 & 8) == 0) {
    return 0;
  }
  local_38 = (SSL_SESSION *)0x0;
  Curl_ssl_sessionid_lock(conn);
  iVar5 = 0;
  sockindex = (int)((ulong)((long)pvVar4 + (-0x270 - (long)conn)) >> 2);
  _Var2 = Curl_ssl_getsessionid(conn,&local_38,(size_t *)0x0,sockindex);
  if ((_Var2) || (local_38 == ssl_sessionid)) {
    if (!_Var2) goto LAB_0014ce3a;
  }
  else {
    Curl_infof(data,"old SSL session ID is stale, removing\n");
    Curl_ssl_delsessionid(conn,local_38);
  }
  iVar5 = 0;
  CVar3 = Curl_ssl_addsessionid(conn,ssl_sessionid,0,sockindex);
  if (CVar3 == CURLE_OK) {
    iVar5 = 1;
  }
  else {
    Curl_failf(data,"failed to store ssl session");
  }
LAB_0014ce3a:
  Curl_ssl_sessionid_unlock(conn);
  return iVar5;
}

Assistant:

static int ossl_new_session_cb(SSL *ssl, SSL_SESSION *ssl_sessionid)
{
  int res = 0;
  struct connectdata *conn;
  struct Curl_easy *data;
  int sockindex;
  curl_socket_t *sockindex_ptr;
  int connectdata_idx = ossl_get_ssl_conn_index();
  int sockindex_idx = ossl_get_ssl_sockindex_index();

  if(connectdata_idx < 0 || sockindex_idx < 0)
    return 0;

  conn = (struct connectdata*) SSL_get_ex_data(ssl, connectdata_idx);
  if(!conn)
    return 0;

  data = conn->data;

  /* The sockindex has been stored as a pointer to an array element */
  sockindex_ptr = (curl_socket_t*) SSL_get_ex_data(ssl, sockindex_idx);
  sockindex = (int)(sockindex_ptr - conn->sock);

  if(SSL_SET_OPTION(primary.sessionid)) {
    bool incache;
    void *old_ssl_sessionid = NULL;

    Curl_ssl_sessionid_lock(conn);
    incache = !(Curl_ssl_getsessionid(conn, &old_ssl_sessionid, NULL,
                                      sockindex));
    if(incache) {
      if(old_ssl_sessionid != ssl_sessionid) {
        infof(data, "old SSL session ID is stale, removing\n");
        Curl_ssl_delsessionid(conn, old_ssl_sessionid);
        incache = FALSE;
      }
    }

    if(!incache) {
      if(!Curl_ssl_addsessionid(conn, ssl_sessionid,
                                      0 /* unknown size */, sockindex)) {
        /* the session has been put into the session cache */
        res = 1;
      }
      else
        failf(data, "failed to store ssl session");
    }
    Curl_ssl_sessionid_unlock(conn);
  }

  return res;
}